

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

void Spl_ManLutFanouts_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vFanouts,Vec_Bit_t *vMarksNo,Vec_Bit_t *vMarksCIO)

{
  int iVar1;
  int local_38;
  int i;
  int iFanout;
  Vec_Bit_t *vMarksCIO_local;
  Vec_Bit_t *vMarksNo_local;
  Vec_Int_t *vFanouts_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_BitEntry(vMarksNo,iObj);
  if ((iVar1 == 0) && (iVar1 = Vec_BitEntry(vMarksCIO,iObj), iVar1 == 0)) {
    iVar1 = Gia_ObjIsLut2(p,iObj);
    if (iVar1 == 0) {
      for (local_38 = 0; iVar1 = Gia_ObjFanoutNumId(p,iObj), local_38 < iVar1;
          local_38 = local_38 + 1) {
        iVar1 = Gia_ObjFanoutId(p,iObj,local_38);
        Spl_ManLutFanouts_rec(p,iVar1,vFanouts,vMarksNo,vMarksCIO);
      }
    }
    else {
      Vec_BitWriteEntry(vMarksCIO,iObj,1);
      Vec_IntPush(vFanouts,iObj);
    }
  }
  return;
}

Assistant:

void Spl_ManLutFanouts_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vFanouts, Vec_Bit_t * vMarksNo, Vec_Bit_t * vMarksCIO )
{
    int iFanout, i;
    if ( Vec_BitEntry(vMarksNo, iObj) || Vec_BitEntry(vMarksCIO, iObj) )
        return;
    if ( Gia_ObjIsLut2(p, iObj) )
    {
        Vec_BitWriteEntry( vMarksCIO, iObj, 1 );
        Vec_IntPush( vFanouts, iObj );
        return;
    }
    Gia_ObjForEachFanoutStaticId( p, iObj, iFanout, i )
        Spl_ManLutFanouts_rec( p, iFanout, vFanouts, vMarksNo, vMarksCIO );
}